

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O2

char * XCore_group_name(csh handle,uint id)

{
  if (1 < id) {
    return (char *)0x0;
  }
  return group_name_maps[id].name;
}

Assistant:

const char *XCore_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= XCORE_GRP_ENDING)
		return NULL;

	return group_name_maps[id].name;
#else
	return NULL;
#endif
}